

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_block.cpp
# Opt level: O2

int duckdb::SBIterator::ComparisonValue(ExpressionType comparison)

{
  InternalException *this;
  allocator local_39;
  string local_38;
  
  if ((byte)(comparison - COMPARE_LESSTHAN) < 4) {
    return *(int *)(&DAT_0202b5b0 + (ulong)(byte)(comparison - COMPARE_LESSTHAN) * 4);
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Unimplemented comparison type for IEJoin!",&local_39);
  InternalException::InternalException(this,&local_38);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

int SBIterator::ComparisonValue(ExpressionType comparison) {
	switch (comparison) {
	case ExpressionType::COMPARE_LESSTHAN:
	case ExpressionType::COMPARE_GREATERTHAN:
		return -1;
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		return 0;
	default:
		throw InternalException("Unimplemented comparison type for IEJoin!");
	}
}